

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O1

bool __thiscall phaeton::TensorDataType::operator==(TensorDataType *this,TensorDataType *RHS)

{
  pointer piVar1;
  pointer piVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint uVar7;
  bool bVar8;
  
  piVar1 = (this->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar1;
  piVar2 = (RHS->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar3 = (long)(RHS->Dims).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)piVar2;
  uVar7 = (uint)(uVar4 >> 2);
  if (uVar7 == (uint)(uVar3 >> 2)) {
    bVar8 = uVar7 == 0;
    if (!bVar8) {
      uVar4 = (long)uVar4 >> 2;
      uVar3 = (long)uVar3 >> 2;
      uVar6 = 0;
      do {
        uVar5 = uVar4;
        if ((uVar4 <= uVar6) || (uVar5 = uVar3, uVar3 <= uVar6)) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar6,uVar5);
        }
        if (piVar1[uVar6] != piVar2[uVar6]) {
          return bVar8;
        }
        uVar6 = uVar6 + 1;
        bVar8 = uVar7 <= (uint)uVar6;
      } while (uVar7 != (uint)uVar6);
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

bool TensorDataType::operator==(const TensorDataType &RHS) const {
  if (getRank() != RHS.getRank()) {
    return false;
  }

  for (unsigned i = 0; i < getRank(); ++i) {
    if (getDim(i) != RHS.getDim(i)) {
      return false;
    }
  }

  return true;
}